

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.cpp
# Opt level: O1

int CheckDevicesState(void)

{
  int iVar1;
  char *pcVar2;
  int bON;
  int local_c;
  
  local_c = 0;
  iVar1 = GetDeviceCurrentState("CurArmadeusState.txt",&local_c);
  if (iVar1 == 0) {
    if (local_c != bArmadeusON) {
      if (local_c == 0) {
        iVar1 = SetRelayOntrak(&ontrak,0,0);
        if (iVar1 != 0) {
          return 1;
        }
        pcVar2 = "Armadeus : OFF.";
      }
      else {
        iVar1 = SetRelayOntrak(&ontrak,0,1);
        if (iVar1 != 0) {
          return 1;
        }
        pcVar2 = "Armadeus : ON.";
      }
      puts(pcVar2);
      fflush(_stdout);
      bArmadeusON = local_c;
    }
    iVar1 = GetDeviceCurrentState("CurBottomPumpState.txt",&local_c);
    if (iVar1 == 0) {
      if (local_c != bBottomPumpON) {
        if (local_c == 0) {
          iVar1 = SetRelayOntrak(&ontrak,1,1);
          if (iVar1 != 0) {
            return 1;
          }
          pcVar2 = "Bottom pump : OFF.";
        }
        else {
          iVar1 = SetRelayOntrak(&ontrak,1,0);
          if (iVar1 != 0) {
            return 1;
          }
          pcVar2 = "Bottom pump : ON.";
        }
        puts(pcVar2);
        fflush(_stdout);
        bBottomPumpON = local_c;
      }
      iVar1 = GetDeviceCurrentState("CurSurfacePumpState.txt",&local_c);
      if (iVar1 == 0) {
        if (local_c != bSurfacePumpON) {
          if (local_c == 0) {
            iVar1 = SetRelayOntrak(&ontrak,2,1);
            if (iVar1 != 0) {
              return 1;
            }
            pcVar2 = "Surface pump : OFF.";
          }
          else {
            iVar1 = SetRelayOntrak(&ontrak,2,0);
            if (iVar1 != 0) {
              return 1;
            }
            pcVar2 = "Surface pump : ON.";
          }
          puts(pcVar2);
          fflush(_stdout);
          bSurfacePumpON = local_c;
        }
        iVar1 = GetDeviceCurrentState("CurProbeState.txt",&local_c);
        if (iVar1 == 0) {
          if (local_c != bProbeON) {
            if (local_c == 0) {
              iVar1 = SetRelayOntrak(&ontrak,4,1);
              if (iVar1 != 0) {
                return 1;
              }
              pcVar2 = "Probe : OFF.";
            }
            else {
              iVar1 = SetRelayOntrak(&ontrak,4,0);
              if (iVar1 != 0) {
                return 1;
              }
              pcVar2 = "Probe : ON.";
            }
            puts(pcVar2);
            fflush(_stdout);
            bProbeON = local_c;
          }
          iVar1 = GetDeviceCurrentState("CurWifiState.txt",&local_c);
          if (iVar1 == 0) {
            if (local_c != bWifiON) {
              if (local_c == 0) {
                iVar1 = SetRelayOntrak(&ontrak,3,0);
                if (iVar1 != 0) {
                  return 1;
                }
                pcVar2 = "Wi-Fi : OFF.";
              }
              else {
                iVar1 = SetRelayOntrak(&ontrak,3,1);
                if (iVar1 != 0) {
                  return 1;
                }
                pcVar2 = "Wi-Fi : ON.";
              }
              puts(pcVar2);
              fflush(_stdout);
              bWifiON = local_c;
            }
            iVar1 = GetDeviceCurrentState("CurIridiumState.txt",&local_c);
            if (iVar1 == 0) {
              if (local_c != bIridiumON) {
                if (local_c == 0) {
                  iVar1 = SetDigitalRelayOntrak(&ontrak,6,1);
                  if (iVar1 != 0) {
                    return 1;
                  }
                  pcVar2 = "Iridium : OFF.";
                }
                else {
                  iVar1 = SetDigitalRelayOntrak(&ontrak,6,0);
                  if (iVar1 != 0) {
                    return 1;
                  }
                  pcVar2 = "Iridium : ON.";
                }
                puts(pcVar2);
                fflush(_stdout);
                bIridiumON = local_c;
              }
              iVar1 = GetDeviceCurrentState("CurSailMotorState.txt",&local_c);
              if (iVar1 == 0) {
                if (local_c == bSailMotorON) {
                  return 0;
                }
                if (local_c == 0) {
                  iVar1 = SetDigitalRelayOntrak(&ontrak,7,1);
                  if (iVar1 != 0) {
                    return 1;
                  }
                  pcVar2 = "Sail motor : OFF.";
                }
                else {
                  iVar1 = SetDigitalRelayOntrak(&ontrak,7,0);
                  if (iVar1 != 0) {
                    return 1;
                  }
                  pcVar2 = "Sail motor : ON.";
                }
                puts(pcVar2);
                fflush(_stdout);
                bSailMotorON = local_c;
                return 0;
              }
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int CheckDevicesState(void)
{
	int bON = 0;

	if (GetDeviceCurrentState("CurArmadeusState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bArmadeusON)
	{
		// Active-low.
		if (bON)
		{
			if (SetRelayOntrak(&ontrak, ARMADEUS_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Armadeus : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetRelayOntrak(&ontrak, ARMADEUS_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Armadeus : OFF.\n"); fflush(stdout);
		}
		bArmadeusON = bON;
	}

	if (GetDeviceCurrentState("CurBottomPumpState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bBottomPumpON)
	{
		if (bON)
		{
			if (SetRelayOntrak(&ontrak, BOTTOM_PUMP_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Bottom pump : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetRelayOntrak(&ontrak, BOTTOM_PUMP_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Bottom pump : OFF.\n"); fflush(stdout);
		}
		bBottomPumpON = bON;
	}

	if (GetDeviceCurrentState("CurSurfacePumpState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bSurfacePumpON)
	{
		if (bON)
		{
			if (SetRelayOntrak(&ontrak, SURFACE_PUMP_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Surface pump : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetRelayOntrak(&ontrak, SURFACE_PUMP_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Surface pump : OFF.\n"); fflush(stdout);
		}
		bSurfacePumpON = bON;
	}

	if (GetDeviceCurrentState("CurProbeState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bProbeON)
	{
		if (bON)
		{
			if (SetRelayOntrak(&ontrak, PROBE_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Probe : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetRelayOntrak(&ontrak, PROBE_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Probe : OFF.\n"); fflush(stdout);
		}
		bProbeON = bON;
	}

	if (GetDeviceCurrentState("CurWifiState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bWifiON)
	{
		// Active-low.
		if (bON)
		{
			if (SetRelayOntrak(&ontrak, WIFI_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Wi-Fi : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetRelayOntrak(&ontrak, WIFI_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Wi-Fi : OFF.\n"); fflush(stdout);
		}
		bWifiON = bON;
	}

	if (GetDeviceCurrentState("CurIridiumState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bIridiumON)
	{
		if (bON)
		{
			if (SetDigitalRelayOntrak(&ontrak, IRIDIUM_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Iridium : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetDigitalRelayOntrak(&ontrak, IRIDIUM_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Iridium : OFF.\n"); fflush(stdout);
		}
		bIridiumON = bON;
	}

	if (GetDeviceCurrentState("CurSailMotorState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bSailMotorON)
	{
		if (bON)
		{
			if (SetDigitalRelayOntrak(&ontrak, SAIL_MOTOR_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Sail motor : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetDigitalRelayOntrak(&ontrak, SAIL_MOTOR_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Sail motor : OFF.\n"); fflush(stdout);
		}
		bSailMotorON = bON;
	}

	return EXIT_SUCCESS;
}